

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

int mbedtls_md_file(mbedtls_md_info_t *md_info,char *path,uchar *output)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  mbedtls_md_context_t ctx;
  uchar buf [1024];
  mbedtls_md_context_t local_448;
  uchar local_428 [1024];
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar1 = -0x5100;
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream == (FILE *)0x0) {
      iVar1 = -0x5200;
    }
    else {
      local_448.md_info = (mbedtls_md_info_t *)0x0;
      local_448.md_ctx = (void *)0x0;
      local_448.hmac_ctx = (void *)0x0;
      local_448.md_ctx = (*md_info->ctx_alloc_func)();
      if (local_448.md_ctx == (void *)0x0) {
        iVar1 = -0x5180;
      }
      else {
        local_448.md_info = md_info;
        iVar1 = (*md_info->starts_func)(local_448.md_ctx);
        if (iVar1 == 0) {
          do {
            sVar3 = fread(local_428,1,0x400,__stream);
            if (sVar3 == 0) {
              iVar2 = ferror(__stream);
              iVar1 = -0x5200;
              if (iVar2 == 0) {
                iVar1 = (*md_info->finish_func)(local_448.md_ctx,output);
              }
              break;
            }
            iVar1 = (*md_info->update_func)(local_448.md_ctx,local_428,sVar3);
          } while (iVar1 == 0);
        }
      }
      lVar4 = 0;
      do {
        local_428[lVar4] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x400);
      fclose(__stream);
      mbedtls_md_free(&local_448);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_md_file( const mbedtls_md_info_t *md_info, const char *path, unsigned char *output )
{
    int ret;
    FILE *f;
    size_t n;
    mbedtls_md_context_t ctx;
    unsigned char buf[1024];

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_MD_FILE_IO_ERROR );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
        goto cleanup;

    if( ( ret = md_info->starts_func( ctx.md_ctx ) ) != 0 )
        goto cleanup;

    while( ( n = fread( buf, 1, sizeof( buf ), f ) ) > 0 )
        if( ( ret = md_info->update_func( ctx.md_ctx, buf, n ) ) != 0 )
            goto cleanup;

    if( ferror( f ) != 0 )
        ret = MBEDTLS_ERR_MD_FILE_IO_ERROR;
    else
        ret = md_info->finish_func( ctx.md_ctx, output );

cleanup:
    mbedtls_zeroize( buf, sizeof( buf ) );
    fclose( f );
    mbedtls_md_free( &ctx );

    return( ret );
}